

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

void slang::ast::addBlockMembers(GenerateBlockSymbol *block,SyntaxNode *syntax)

{
  bool bVar1;
  GenerateBlockSyntax *pGVar2;
  reference ppMVar3;
  SyntaxNode *in_RSI;
  MemberSyntax *member;
  iterator __end3;
  iterator __begin3;
  SyntaxList<slang::syntax::MemberSyntax> *__range3;
  SyntaxNode *in_stack_00000628;
  Scope *in_stack_00000630;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *in_stack_ffffffffffffffc8;
  MemberSyntax *in_stack_ffffffffffffffd0;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *in_stack_ffffffffffffffd8;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  local_20;
  SyntaxList<slang::syntax::MemberSyntax> *local_18;
  
  if (in_RSI->kind == GenerateBlock) {
    pGVar2 = slang::syntax::SyntaxNode::as<slang::syntax::GenerateBlockSyntax>(in_RSI);
    local_18 = &pGVar2->members;
    local_20._M_current =
         (MemberSyntax **)
         std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                   (in_stack_ffffffffffffffc8);
    std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end(in_stack_ffffffffffffffd8)
    ;
    while (bVar1 = __gnu_cxx::
                   operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                             ((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffffd0,
                              (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffffc8), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppMVar3 = __gnu_cxx::
                __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                ::operator*(&local_20);
      in_stack_ffffffffffffffd0 = *ppMVar3;
      Scope::addMembers(in_stack_00000630,in_stack_00000628);
      __gnu_cxx::
      __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
      ::operator++(&local_20);
    }
  }
  else {
    Scope::addMembers(in_stack_00000630,in_stack_00000628);
  }
  return;
}

Assistant:

static void addBlockMembers(GenerateBlockSymbol& block, const SyntaxNode& syntax) {
    if (syntax.kind != SyntaxKind::GenerateBlock) {
        block.addMembers(syntax);
    }
    else {
        for (auto member : syntax.as<GenerateBlockSyntax>().members)
            block.addMembers(*member);
    }
}